

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O1

Vec_Int_t * Abc_NtkCollectCiCones(Abc_Ntk_t *pNtk,int fVerbose)

{
  uint uVar1;
  int iVar2;
  Vec_Ptr_t *__ptr;
  Vec_Int_t *vArr;
  Vec_Int_t *pVVar3;
  int *piVar4;
  uint *__ptr_00;
  void *pvVar5;
  Vec_Ptr_t *pVVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  timespec ts;
  timespec local_88;
  long local_70;
  int local_64;
  ulong local_60;
  Vec_Int_t *local_58;
  void *local_50;
  Vec_Ptr_t *local_48;
  long local_40;
  long local_38;
  
  local_64 = fVerbose;
  iVar2 = clock_gettime(3,&local_88);
  if (iVar2 < 0) {
    local_70 = 1;
  }
  else {
    lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_88.tv_nsec),8);
    local_70 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_88.tv_sec * -1000000;
  }
  piVar4 = (int *)0x0;
  __ptr = Abc_NtkDfs(pNtk,0);
  vArr = (Vec_Int_t *)malloc(0x10);
  vArr->nCap = 0;
  vArr->nSize = 0;
  vArr->pArray = (int *)0x0;
  iVar2 = pNtk->vCis->nSize;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < iVar2 - 1U) {
    iVar7 = iVar2;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar7;
  if (iVar7 != 0) {
    piVar4 = (int *)malloc((long)iVar7 << 2);
  }
  pVVar3->pArray = piVar4;
  uVar1 = pNtk->vObjs->nSize;
  __ptr_00 = (uint *)malloc(0x10);
  uVar8 = 8;
  if (6 < uVar1 - 1) {
    uVar8 = uVar1;
  }
  __ptr_00[1] = 0;
  *__ptr_00 = uVar8;
  local_60 = (ulong)uVar1;
  local_58 = pVVar3;
  if (uVar8 == 0) {
    pvVar5 = (void *)0x0;
  }
  else {
    pvVar5 = calloc((long)(int)uVar8,0x10);
  }
  *(void **)(__ptr_00 + 2) = pvVar5;
  __ptr_00[1] = (uint)local_60;
  lVar9 = (long)__ptr->nSize;
  if (0 < lVar9) {
    do {
      local_48 = __ptr;
      local_50 = pvVar5;
      if (local_48->nSize < lVar9) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      lVar10 = lVar9 + -1;
      pvVar5 = local_48->pArray[lVar10];
      iVar2 = *(int *)((long)pvVar5 + 0x10);
      local_38 = lVar9;
      if (((long)iVar2 < 0) || ((int)local_60 <= iVar2)) goto LAB_0028cad9;
      pVVar3 = (Vec_Int_t *)((long)iVar2 * 0x10 + (long)local_50);
      local_40 = lVar10;
      Vec_IntPush(pVVar3,(int)lVar10);
      if (0 < *(int *)((long)pvVar5 + 0x1c)) {
        lVar9 = 0;
        do {
          iVar2 = *(int *)(*(long *)((long)pvVar5 + 0x20) + lVar9 * 4);
          if (((long)iVar2 < 0) || ((int)__ptr_00[1] <= iVar2)) goto LAB_0028cad9;
          lVar10 = *(long *)(__ptr_00 + 2);
          lVar11 = (long)iVar2 * 0x10;
          Vec_IntTwoMerge2((Vec_Int_t *)(lVar11 + lVar10),pVVar3,vArr);
          local_88.tv_sec = *(long *)(lVar10 + lVar11);
          local_88.tv_nsec = ((long *)(lVar10 + lVar11))[1];
          piVar4 = vArr->pArray;
          *(undefined8 *)(lVar10 + lVar11) = *(undefined8 *)vArr;
          ((undefined8 *)(lVar10 + lVar11))[1] = piVar4;
          vArr->nCap = (int)local_88.tv_sec;
          vArr->nSize = (int)((ulong)local_88.tv_sec >> 0x20);
          vArr->pArray = (int *)local_88.tv_nsec;
          lVar9 = lVar9 + 1;
        } while (lVar9 < *(int *)((long)pvVar5 + 0x1c));
      }
      lVar9 = local_40;
      __ptr = local_48;
      pvVar5 = local_50;
    } while (1 < local_38);
  }
  pVVar3 = local_58;
  pVVar6 = pNtk->vCis;
  if (0 < pVVar6->nSize) {
    lVar9 = 0;
    do {
      iVar2 = *(int *)((long)pVVar6->pArray[lVar9] + 0x10);
      if (((long)iVar2 < 0) || ((int)__ptr_00[1] <= iVar2)) {
LAB_0028cad9:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                      ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      Vec_IntPush(pVVar3,*(int *)(*(long *)(__ptr_00 + 2) + 4 + (long)iVar2 * 0x10));
      lVar9 = lVar9 + 1;
      pVVar6 = pNtk->vCis;
    } while (lVar9 < pVVar6->nSize);
  }
  uVar1 = *__ptr_00;
  if (0 < (long)(int)uVar1) {
    lVar9 = *(long *)(__ptr_00 + 2);
    lVar10 = 0;
    do {
      pvVar5 = *(void **)(lVar9 + 8 + lVar10);
      if (pvVar5 != (void *)0x0) {
        free(pvVar5);
        *(undefined8 *)(lVar9 + 8 + lVar10) = 0;
      }
      lVar10 = lVar10 + 0x10;
    } while ((long)(int)uVar1 * 0x10 != lVar10);
  }
  if (*(void **)(__ptr_00 + 2) != (void *)0x0) {
    free(*(void **)(__ptr_00 + 2));
    __ptr_00[2] = 0;
    __ptr_00[3] = 0;
  }
  __ptr_00[0] = 0;
  __ptr_00[1] = 0;
  free(__ptr_00);
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (void **)0x0;
  }
  if (__ptr != (Vec_Ptr_t *)0x0) {
    free(__ptr);
  }
  if (vArr->pArray != (int *)0x0) {
    free(vArr->pArray);
    vArr->pArray = (int *)0x0;
  }
  free(vArr);
  if (local_64 != 0) {
    iVar7 = 3;
    iVar2 = clock_gettime(3,&local_88);
    if (iVar2 < 0) {
      lVar9 = -1;
    }
    else {
      lVar9 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
    }
    lVar9 = lVar9 + local_70;
    Abc_Print(iVar7,"%s =","Output cone computation");
    Abc_Print(iVar7,"%9.2f sec\n",SUB84((double)lVar9 / 1000000.0,0));
  }
  return pVVar3;
}

Assistant:

Vec_Int_t * Abc_NtkCollectCiCones( Abc_Ntk_t * pNtk, int fVerbose )
{
    abctime clk = Abc_Clock();
    Abc_Obj_t * pNode; int i, k;
    Vec_Ptr_t * vNodes = Abc_NtkDfs( pNtk, 0 );
    Vec_Int_t * vFanin, * vFanout, * vTemp = Vec_IntAlloc( 0 );
    Vec_Int_t * vSuppsCi = Vec_IntAlloc( Abc_NtkCiNum(pNtk) );
    Vec_Wec_t * vSupps = Vec_WecStart( Abc_NtkObjNumMax(pNtk) );
    Vec_PtrForEachEntryReverse( Abc_Obj_t *, vNodes, pNode, i )
    {
        vFanout = Vec_WecEntry(vSupps, Abc_ObjId(pNode));
        Vec_IntPush( vFanout, i );
        for ( k = 0; k < Abc_ObjFaninNum(pNode); k++ )
        {
            vFanin = Vec_WecEntry(vSupps, Abc_ObjFaninId(pNode, k));
            Vec_IntTwoMerge2( vFanin, vFanout, vTemp );
            ABC_SWAP( Vec_Int_t, *vFanin, *vTemp );
        }
    }
    Abc_NtkForEachCi( pNtk, pNode, i )
        Vec_IntPush( vSuppsCi, Vec_IntSize(Vec_WecEntry(vSupps, Abc_ObjId(pNode))) );
    Vec_WecFree( vSupps );
    Vec_PtrFree( vNodes );
    Vec_IntFree( vTemp );
    if ( fVerbose )
        Abc_PrintTime( 1, "Output cone computation", Abc_Clock() - clk );
    //Vec_IntPrint( vSuppsCi );
    return vSuppsCi;
}